

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O1

bool __thiscall
ON_NurbsSurface::Split
          (ON_NurbsSurface *this,int dir,double c,ON_Surface **west_or_south_side,
          ON_Surface **east_or_north_side)

{
  double *pdVar1;
  double *pdVar2;
  bool bVar3;
  ON_NurbsCurve *pOVar4;
  ON_NurbsSurface *this_00;
  ulong uVar5;
  _func_int **pp_Var6;
  int iVar7;
  uint uVar8;
  ON_NurbsSurface *pOVar9;
  ON_Curve *right_side;
  ON_Curve *left_side;
  ON_NurbsCurve crv;
  ON_NurbsCurve right_crv;
  ON_NurbsCurve left_crv;
  ON_NurbsSurface *local_128;
  ON_NurbsCurve *local_100;
  ON_NurbsCurve *local_f8;
  ON_NurbsCurve local_f0;
  ON_NurbsCurve local_b0;
  ON_NurbsCurve local_70;
  
  if ((uint)dir < 2) {
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])();
    bVar3 = ON_Interval::Includes((ON_Interval *)&local_f0,c,true);
    if (bVar3) {
      this_00 = (ON_NurbsSurface *)*west_or_south_side;
      if (this_00 == (ON_NurbsSurface *)0x0) {
        this_00 = (ON_NurbsSurface *)0x0;
      }
      else {
        bVar3 = ON_Object::IsKindOf((ON_Object *)this_00,&m_ON_NurbsSurface_class_rtti);
        pOVar9 = (ON_NurbsSurface *)0x0;
        if (!bVar3) {
          this_00 = pOVar9;
        }
        if (this_00 == (ON_NurbsSurface *)0x0) goto LAB_0054cb7d;
        ON_Surface::DestroySurfaceTree(&this_00->super_ON_Surface);
      }
      local_128 = (ON_NurbsSurface *)*east_or_north_side;
      if (local_128 == (ON_NurbsSurface *)0x0) {
        local_128 = (ON_NurbsSurface *)0x0;
      }
      else {
        bVar3 = ON_Object::IsKindOf((ON_Object *)local_128,&m_ON_NurbsSurface_class_rtti);
        pOVar9 = (ON_NurbsSurface *)0x0;
        if (!bVar3) {
          local_128 = pOVar9;
        }
        if (local_128 == (ON_NurbsSurface *)0x0) goto LAB_0054cb7d;
        ON_Surface::DestroySurfaceTree(&local_128->super_ON_Surface);
      }
      ON_NurbsCurve::ON_NurbsCurve(&local_f0);
      ON_NurbsCurve::ON_NurbsCurve(&local_70);
      ON_NurbsCurve::ON_NurbsCurve(&local_b0);
      pOVar4 = ToCurve(this,dir,&local_f0);
      if ((pOVar4 == (ON_NurbsCurve *)0x0) ||
         (local_100 = &local_b0, local_f8 = &local_70,
         bVar3 = ON_NurbsCurve::Split(&local_f0,c,(ON_Curve **)&local_f8,(ON_Curve **)&local_100),
         !bVar3)) {
LAB_0054ce6f:
        pOVar9 = (ON_NurbsSurface *)0x0;
      }
      else {
        if (this_00 == (ON_NurbsSurface *)0x0) {
          this_00 = (ON_NurbsSurface *)operator_new(0x58);
          ON_NurbsSurface(this_00);
        }
        if (this_00 != this) {
          this_00->m_dim = this->m_dim;
          this_00->m_is_rat = this->m_is_rat;
          iVar7 = dir + -1;
          bVar3 = iVar7 != 0;
          uVar8 = -iVar7;
          uVar5 = (ulong)(uint)(iVar7 * -4);
          *(undefined4 *)((long)this_00->m_order + uVar5) =
               *(undefined4 *)((long)this->m_order + uVar5);
          *(undefined4 *)((long)this_00->m_cv_count + uVar5) =
               *(undefined4 *)((long)this->m_cv_count + uVar5);
          iVar7 = ON_KnotCount(*(int *)((long)this->m_order + (ulong)((uint)bVar3 * 4)),
                               *(int *)((long)this->m_cv_count + (ulong)((uint)bVar3 * 4)));
          ReserveKnotCapacity(this_00,uVar8,iVar7);
          pdVar1 = this_00->m_knot[uVar8];
          pdVar2 = this->m_knot[uVar8];
          iVar7 = ON_KnotCount(this->m_order[bVar3],this->m_cv_count[bVar3]);
          memcpy(pdVar1,pdVar2,(long)iVar7 << 3);
        }
        bVar3 = FromCurve(&local_70,this_00,dir);
        if (!bVar3) {
          local_128 = this_00;
          if ((this_00 == this) || (this_00 == (ON_NurbsSurface *)*west_or_south_side))
          goto LAB_0054ce67;
          pp_Var6 = (this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object;
LAB_0054ce5f:
          (*pp_Var6[4])(this_00);
          goto LAB_0054ce6f;
        }
        if (local_128 == (ON_NurbsSurface *)0x0) {
          local_128 = (ON_NurbsSurface *)operator_new(0x58);
          ON_NurbsSurface(local_128);
        }
        if (local_128 != this) {
          local_128->m_dim = this->m_dim;
          local_128->m_is_rat = this->m_is_rat;
          iVar7 = dir + -1;
          bVar3 = iVar7 != 0;
          uVar8 = -iVar7;
          uVar5 = (ulong)(uint)(iVar7 * -4);
          *(undefined4 *)((long)local_128->m_order + uVar5) =
               *(undefined4 *)((long)this->m_order + uVar5);
          *(undefined4 *)((long)local_128->m_cv_count + uVar5) =
               *(undefined4 *)((long)this->m_cv_count + uVar5);
          iVar7 = ON_KnotCount(*(int *)((long)this->m_order + (ulong)((uint)bVar3 * 4)),
                               *(int *)((long)this->m_cv_count + (ulong)((uint)bVar3 * 4)));
          ReserveKnotCapacity(local_128,uVar8,iVar7);
          pdVar1 = local_128->m_knot[uVar8];
          pdVar2 = this->m_knot[uVar8];
          iVar7 = ON_KnotCount(this->m_order[bVar3],this->m_cv_count[bVar3]);
          memcpy(pdVar1,pdVar2,(long)iVar7 << 3);
        }
        bVar3 = FromCurve(&local_b0,local_128,dir);
        if (!bVar3) {
          if (this_00 == (ON_NurbsSurface *)*west_or_south_side || this_00 == this) {
            Destroy(this_00);
          }
          else {
            (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])
                      (this_00);
          }
          if ((local_128 != this) && (local_128 != (ON_NurbsSurface *)*east_or_north_side)) {
            pp_Var6 = (local_128->super_ON_Surface).super_ON_Geometry.super_ON_Object.
                      _vptr_ON_Object;
            this_00 = local_128;
            goto LAB_0054ce5f;
          }
LAB_0054ce67:
          Destroy(local_128);
          goto LAB_0054ce6f;
        }
        if ((ON_NurbsSurface *)*west_or_south_side == (ON_NurbsSurface *)0x0) {
          *west_or_south_side = &this_00->super_ON_Surface;
        }
        pOVar9 = (ON_NurbsSurface *)0x1;
        if (*east_or_north_side == (ON_Surface *)0x0) {
          *east_or_north_side = &local_128->super_ON_Surface;
        }
      }
      ON_NurbsCurve::~ON_NurbsCurve(&local_b0);
      ON_NurbsCurve::~ON_NurbsCurve(&local_70);
      ON_NurbsCurve::~ON_NurbsCurve(&local_f0);
      goto LAB_0054cb7d;
    }
  }
  pOVar9 = (ON_NurbsSurface *)0x0;
LAB_0054cb7d:
  return SUB81(pOVar9,0);
}

Assistant:

bool ON_NurbsSurface::Split(
       int dir,
       double c,
       ON_Surface*& west_or_south_side,
       ON_Surface*& east_or_north_side
       ) const
{
  if ( dir < 0 || dir > 1 )
    return false;
  if ( !Domain(dir).Includes( c, true ) )
    return false;
  ON_NurbsSurface* left_srf = 0;
  ON_NurbsSurface* right_srf = 0;

  if ( west_or_south_side )
  {
    left_srf = ON_NurbsSurface::Cast( west_or_south_side );
    if ( !left_srf )
      return false;
    left_srf->DestroySurfaceTree();
  }

  if ( east_or_north_side )
  {
    right_srf = ON_NurbsSurface::Cast( east_or_north_side );
    if ( !right_srf )
      return false;
    right_srf->DestroySurfaceTree();
  }

  ON_NurbsCurve crv, left_crv, right_crv;
  if ( !ToCurve( *this, dir, &crv ) )
    return false;
  ON_Curve *left_side, *right_side;
  left_side = &left_crv;
  right_side = &right_crv;
  if ( !crv.Split( c, left_side, right_side ) )
    return false;
  
  if ( !left_srf )
    left_srf = new ON_NurbsSurface();

  if ( left_srf != this )
  {
    left_srf->m_dim = m_dim;
    left_srf->m_is_rat = m_is_rat;
    left_srf->m_order[1-dir] = m_order[1-dir];
    left_srf->m_cv_count[1-dir] = m_cv_count[1-dir];
    left_srf->ReserveKnotCapacity(1-dir,KnotCount(1-dir));
    memcpy( left_srf->m_knot[1-dir], m_knot[1-dir], KnotCount(1-dir)*sizeof(m_knot[1-dir][0] ) );
  }

  if ( !FromCurve( left_crv, *left_srf, dir ) )
  {
    if ( left_srf != this && left_srf !=  west_or_south_side )
      delete left_srf;
    else
      left_srf->Destroy();

    return false;
  }

  if ( !right_srf )
    right_srf = new ON_NurbsSurface();

  if ( right_srf != this )
  {
    right_srf->m_dim = m_dim;
    right_srf->m_is_rat = m_is_rat;
    right_srf->m_order[1-dir] = m_order[1-dir];
    right_srf->m_cv_count[1-dir] = m_cv_count[1-dir];
    right_srf->ReserveKnotCapacity(1-dir,KnotCount(1-dir));
    memcpy( right_srf->m_knot[1-dir], m_knot[1-dir], KnotCount(1-dir)*sizeof(m_knot[1-dir][0] ) );
  }

  if ( !FromCurve( right_crv, *right_srf, dir ) )
  {
    if ( left_srf != this && left_srf !=  west_or_south_side )
      delete left_srf;
    else
      left_srf->Destroy();

    if ( right_srf != this && right_srf !=  east_or_north_side )
      delete right_srf;
    else
      right_srf->Destroy();

    return false;
  }

  if ( !west_or_south_side)
    west_or_south_side = left_srf;

  if ( !east_or_north_side)
    east_or_north_side = right_srf;

  return true;  
}